

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O2

int __thiscall libDAI::NDP::init(NDP *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ostream *poVar2;
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((char)iVar1 == '\0') {
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"ndp.cpp, line 150",&local_39);
    Exception::Exception(this_00,8,&local_38);
    __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->Props).verbose != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"NDP initialized at verbose=");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    return (int)poVar2;
  }
  return iVar1;
}

Assistant:

void NDP::init() { //messages (one for each edge?) are initialized with uniform probabilities
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);
        /*
        for( vector<Prob>::iterator mij = _messages.begin(); mij != _messages.end(); mij++ )
            //mij->fill(1.0 / mij->size());
            //mij->fill(0.0 ); //FRANS Max-plus initialized on 0.0
            mij->fill( (double) rand() * 50 / RAND_MAX ); //FRANS Max-plus initialized on 0.0
        _newmessages = _messages;
        */
        if( Props.verbose >= 1)
            cout << "NDP initialized at verbose="<<Props.verbose<<endl;
    }